

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O1

int Test_N_VScaleAddMultiVectorArray(N_Vector V,sunindextype param_2,int myid)

{
  sunindextype sVar1;
  N_Vector X;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  N_Vector *X_00;
  long lVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  N_Vector *Y [3];
  N_Vector *Z [3];
  timespec spec;
  realtype a [3];
  int local_bc;
  N_Vector *local_a8;
  N_Vector *local_a0;
  N_Vector *local_98;
  sunindextype local_90;
  N_Vector *local_88;
  N_Vector *local_80;
  N_Vector *local_78;
  timespec local_68;
  realtype local_58 [4];
  N_Vector local_38;
  
  local_90 = param_2;
  X_00 = N_VCloneVectorArray(3,V);
  local_a8 = N_VCloneVectorArray(3,V);
  local_a0 = N_VCloneVectorArray(3,V);
  local_98 = N_VCloneVectorArray(3,V);
  local_88 = N_VCloneVectorArray(3,V);
  local_80 = N_VCloneVectorArray(3,V);
  local_38 = V;
  local_78 = N_VCloneVectorArray(3,V);
  local_58[0] = 2.0;
  N_VConst(1.0,*X_00);
  N_VConst(-1.0,*local_a8);
  clock_gettime(4,&local_68);
  lVar11 = local_68.tv_sec - base_time_tv_sec;
  dVar13 = (double)local_68.tv_nsec;
  local_bc = 1;
  iVar2 = N_VScaleAddMultiVectorArray(1,1,local_58,X_00,&local_a8,&local_a8);
  sync_device();
  clock_gettime(4,&local_68);
  lVar12 = local_68.tv_sec - base_time_tv_sec;
  dVar14 = (double)local_68.tv_nsec;
  if (iVar2 == 0) {
    iVar2 = check_ans(1.0,*local_a8,local_90);
    if (iVar2 != 0) goto LAB_0010b4f5;
    local_bc = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMultiVectorArray Case 1a ");
    }
  }
  else {
LAB_0010b4f5:
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 1a, Proc %d \n",(ulong)(uint)myid);
  }
  X = local_38;
  max_time(local_38,(dVar14 / 1000000000.0 + (double)lVar12) -
                    (dVar13 / 1000000000.0 + (double)lVar11));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VScaleAddMultiVectorArray");
  }
  local_58[0] = 2.0;
  N_VConst(1.0,*X_00);
  N_VConst(-1.0,*local_a8);
  N_VConst(0.0,*local_88);
  clock_gettime(4,&local_68);
  lVar11 = local_68.tv_sec - base_time_tv_sec;
  dVar14 = (double)local_68.tv_nsec;
  iVar2 = N_VScaleAddMultiVectorArray(1,1,local_58,X_00,&local_a8,&local_88);
  sync_device();
  clock_gettime(4,&local_68);
  lVar12 = local_68.tv_sec - base_time_tv_sec;
  dVar13 = (double)local_68.tv_nsec;
  if (iVar2 == 0) {
    iVar2 = check_ans(1.0,*local_88,local_90);
    if (iVar2 != 0) goto LAB_0010b65e;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMultiVectorArray Case 1b ");
    }
  }
  else {
LAB_0010b65e:
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 1b, Proc %d \n",(ulong)(uint)myid);
    local_bc = local_bc + 1;
  }
  max_time(X,(dVar13 / 1000000000.0 + (double)lVar12) - (dVar14 / 1000000000.0 + (double)lVar11));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VScaleAddMultiVectorArray");
  }
  local_58[0] = 1.0;
  local_58[1] = -2.0;
  local_58[2] = 2.0;
  N_VConst(1.0,*X_00);
  N_VConst(-2.0,*local_a8);
  N_VConst(2.0,*local_a0);
  N_VConst(-1.0,*local_98);
  clock_gettime(4,&local_68);
  lVar11 = local_68.tv_sec - base_time_tv_sec;
  dVar14 = (double)local_68.tv_nsec;
  iVar2 = N_VScaleAddMultiVectorArray(1,3,local_58,X_00,&local_a8,&local_a8);
  sync_device();
  clock_gettime(4,&local_68);
  sVar1 = local_90;
  lVar12 = local_68.tv_sec - base_time_tv_sec;
  dVar13 = (double)local_68.tv_nsec;
  if (iVar2 == 0) {
    iVar2 = check_ans(-1.0,*local_a8,local_90);
    iVar3 = check_ans(0.0,*local_a0,sVar1);
    iVar4 = check_ans(1.0,*local_98,sVar1);
    if (iVar4 + iVar3 + iVar2 != 0) goto LAB_0010b839;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMultiVectorArray Case 2a ");
    }
  }
  else {
LAB_0010b839:
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 2a, Proc %d \n",(ulong)(uint)myid);
    local_bc = local_bc + 1;
  }
  max_time(X,(dVar13 / 1000000000.0 + (double)lVar12) - (dVar14 / 1000000000.0 + (double)lVar11));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VScaleAddMultiVectorArray");
  }
  local_58[0] = 1.0;
  local_58[1] = -2.0;
  local_58[2] = 2.0;
  N_VConst(1.0,*X_00);
  N_VConst(-2.0,*local_a8);
  N_VConst(2.0,*local_a0);
  N_VConst(-1.0,*local_98);
  N_VConst(0.0,*local_88);
  N_VConst(1.0,*local_80);
  N_VConst(2.0,*local_78);
  clock_gettime(4,&local_68);
  lVar11 = local_68.tv_sec - base_time_tv_sec;
  dVar14 = (double)local_68.tv_nsec;
  iVar2 = N_VScaleAddMultiVectorArray(1,3,local_58,X_00,&local_a8,&local_88);
  sync_device();
  clock_gettime(4,&local_68);
  sVar1 = local_90;
  lVar12 = local_68.tv_sec - base_time_tv_sec;
  dVar13 = (double)local_68.tv_nsec;
  if (iVar2 == 0) {
    iVar2 = check_ans(-1.0,*local_88,local_90);
    iVar3 = check_ans(0.0,*local_80,sVar1);
    iVar4 = check_ans(1.0,*local_78,sVar1);
    if (iVar4 + iVar3 + iVar2 != 0) goto LAB_0010ba50;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMultiVectorArray Case 2b ");
    }
  }
  else {
LAB_0010ba50:
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 2b, Proc %d \n",(ulong)(uint)myid);
    local_bc = local_bc + 1;
  }
  max_time(X,(dVar13 / 1000000000.0 + (double)lVar12) - (dVar14 / 1000000000.0 + (double)lVar11));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VScaleAddMultiVectorArray");
  }
  local_58[0] = 2.0;
  N_VConst(0.5,*X_00);
  N_VConst(-1.0,X_00[1]);
  N_VConst(1.0,X_00[2]);
  N_VConst(-2.0,*local_a8);
  N_VConst(2.0,local_a8[1]);
  N_VConst(-1.0,local_a8[2]);
  clock_gettime(4,&local_68);
  lVar11 = local_68.tv_sec - base_time_tv_sec;
  dVar14 = (double)local_68.tv_nsec;
  iVar2 = N_VScaleAddMultiVectorArray(3,1,local_58,X_00,&local_a8,&local_a8);
  sync_device();
  clock_gettime(4,&local_68);
  sVar1 = local_90;
  lVar12 = local_68.tv_sec - base_time_tv_sec;
  dVar13 = (double)local_68.tv_nsec;
  if (iVar2 == 0) {
    iVar2 = check_ans(-1.0,*local_a8,local_90);
    iVar3 = check_ans(0.0,local_a8[1],sVar1);
    iVar4 = check_ans(1.0,local_a8[2],sVar1);
    if (iVar4 + iVar3 + iVar2 != 0) goto LAB_0010bc33;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMultiVectorArray Case 3a ");
    }
  }
  else {
LAB_0010bc33:
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 3a, Proc %d \n",(ulong)(uint)myid);
    local_bc = local_bc + 1;
  }
  max_time(X,(dVar13 / 1000000000.0 + (double)lVar12) - (dVar14 / 1000000000.0 + (double)lVar11));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VScaleAddMultiVectorArray");
  }
  local_58[0] = 2.0;
  N_VConst(0.5,*X_00);
  N_VConst(-1.0,X_00[1]);
  N_VConst(1.0,X_00[2]);
  N_VConst(-2.0,*local_a8);
  N_VConst(2.0,local_a8[1]);
  N_VConst(-1.0,local_a8[2]);
  N_VConst(2.0,*local_88);
  N_VConst(2.0,local_88[1]);
  N_VConst(2.0,local_88[2]);
  clock_gettime(4,&local_68);
  lVar11 = local_68.tv_sec - base_time_tv_sec;
  dVar14 = (double)local_68.tv_nsec;
  iVar2 = N_VScaleAddMultiVectorArray(3,1,local_58,X_00,&local_a8,&local_88);
  sync_device();
  clock_gettime(4,&local_68);
  sVar1 = local_90;
  lVar12 = local_68.tv_sec - base_time_tv_sec;
  dVar13 = (double)local_68.tv_nsec;
  if (iVar2 == 0) {
    iVar2 = check_ans(-1.0,*local_88,local_90);
    iVar3 = check_ans(0.0,local_88[1],sVar1);
    iVar4 = check_ans(1.0,local_88[2],sVar1);
    if (iVar4 + iVar3 + iVar2 != 0) goto LAB_0010be59;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMultiVectorArray Case 3b ");
    }
  }
  else {
LAB_0010be59:
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 3b, Proc %d \n",(ulong)(uint)myid);
    local_bc = local_bc + 1;
  }
  max_time(X,(dVar13 / 1000000000.0 + (double)lVar12) - (dVar14 / 1000000000.0 + (double)lVar11));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VScaleAddMultiVectorArray");
  }
  local_58[0] = 2.0;
  local_58[1] = 1.0;
  local_58[2] = -2.0;
  N_VConst(0.5,*X_00);
  N_VConst(-2.0,*local_a8);
  N_VConst(-0.5,*local_a0);
  N_VConst(2.0,*local_98);
  N_VConst(1.0,X_00[1]);
  N_VConst(-1.0,local_a8[1]);
  N_VConst(-2.0,local_a0[1]);
  N_VConst(2.0,local_98[1]);
  N_VConst(-2.0,X_00[2]);
  N_VConst(2.0,local_a8[2]);
  N_VConst(4.0,local_a0[2]);
  N_VConst(-4.0,local_98[2]);
  clock_gettime(4,&local_68);
  lVar11 = local_68.tv_sec - base_time_tv_sec;
  dVar14 = (double)local_68.tv_nsec;
  iVar2 = N_VScaleAddMultiVectorArray(3,3,local_58,X_00,&local_a8,&local_a8);
  sync_device();
  clock_gettime(4,&local_68);
  sVar1 = local_90;
  lVar12 = local_68.tv_sec - base_time_tv_sec;
  dVar13 = (double)local_68.tv_nsec;
  if (iVar2 == 0) {
    iVar2 = check_ans(-1.0,*local_a8,local_90);
    iVar3 = check_ans(0.0,*local_a0,sVar1);
    iVar4 = check_ans(1.0,*local_98,sVar1);
    iVar5 = check_ans(1.0,local_a8[1],sVar1);
    iVar6 = check_ans(-1.0,local_a0[1],sVar1);
    iVar7 = check_ans(0.0,local_98[1],sVar1);
    iVar8 = check_ans(-2.0,local_a8[2],sVar1);
    iVar9 = check_ans(2.0,local_a0[2],sVar1);
    iVar10 = check_ans(0.0,local_98[2],sVar1);
    if (iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 != 0)
    goto LAB_0010c186;
    if (myid == 0) {
      puts("PASSED test -- N_VScaleAddMultiVectorArray Case 4a ");
    }
  }
  else {
LAB_0010c186:
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 4a, Proc %d \n",(ulong)(uint)myid);
    local_bc = local_bc + 1;
  }
  max_time(X,(dVar13 / 1000000000.0 + (double)lVar12) - (dVar14 / 1000000000.0 + (double)lVar11));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VScaleAddMultiVectorArray");
  }
  local_58[0] = 2.0;
  local_58[1] = 1.0;
  local_58[2] = -2.0;
  N_VConst(0.5,*X_00);
  N_VConst(-2.0,*local_a8);
  N_VConst(-0.5,*local_a0);
  N_VConst(2.0,*local_98);
  N_VConst(0.5,*local_88);
  N_VConst(0.5,*local_80);
  N_VConst(0.5,*local_78);
  N_VConst(1.0,X_00[1]);
  N_VConst(-1.0,local_a8[1]);
  N_VConst(-2.0,local_a0[1]);
  N_VConst(2.0,local_98[1]);
  N_VConst(0.5,local_88[1]);
  N_VConst(0.5,local_80[1]);
  N_VConst(0.5,local_78[1]);
  N_VConst(-2.0,X_00[2]);
  N_VConst(2.0,local_a8[2]);
  N_VConst(4.0,local_a0[2]);
  N_VConst(-4.0,local_98[2]);
  N_VConst(0.5,local_88[2]);
  N_VConst(0.5,local_80[2]);
  N_VConst(0.5,local_78[2]);
  clock_gettime(4,&local_68);
  lVar11 = local_68.tv_sec - base_time_tv_sec;
  dVar13 = (double)local_68.tv_nsec;
  iVar2 = N_VScaleAddMultiVectorArray(3,3,local_58,X_00,&local_a8,&local_88);
  sync_device();
  clock_gettime(4,&local_68);
  sVar1 = local_90;
  lVar12 = local_68.tv_sec - base_time_tv_sec;
  if (iVar2 == 0) {
    iVar2 = check_ans(-1.0,*local_88,local_90);
    iVar3 = check_ans(0.0,*local_80,sVar1);
    iVar4 = check_ans(1.0,*local_78,sVar1);
    iVar5 = check_ans(1.0,local_88[1],sVar1);
    iVar6 = check_ans(-1.0,local_80[1],sVar1);
    iVar7 = check_ans(0.0,local_78[1],sVar1);
    iVar8 = check_ans(-2.0,local_88[2],sVar1);
    iVar9 = check_ans(2.0,local_80[2],sVar1);
    iVar10 = check_ans(0.0,local_78[2],sVar1);
    if (iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 == 0) {
      if (myid == 0) {
        puts("PASSED test -- N_VScaleAddMultiVectorArray Case 4b ");
      }
      goto LAB_0010c58c;
    }
  }
  printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 4b, Proc %d \n",(ulong)(uint)myid);
  local_bc = local_bc + 1;
LAB_0010c58c:
  max_time(X,((double)local_68.tv_nsec / 1000000000.0 + (double)lVar12) -
             (dVar13 / 1000000000.0 + (double)lVar11));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VScaleAddMultiVectorArray");
  }
  N_VDestroyVectorArray(X_00,3);
  N_VDestroyVectorArray(local_a8,3);
  N_VDestroyVectorArray(local_a0,3);
  N_VDestroyVectorArray(local_98,3);
  N_VDestroyVectorArray(local_88,3);
  N_VDestroyVectorArray(local_80,3);
  N_VDestroyVectorArray(local_78,3);
  return local_bc;
}

Assistant:

int Test_N_VScaleAddMultiVectorArray(N_Vector V, sunindextype local_length, int myid)
{
  int      fails = 0, failure = 0, ierr = 0;
  double   start_time, stop_time, maxt;

  realtype  a[3];
  N_Vector* X;
  N_Vector* Y[3];
  N_Vector* Z[3];


  /* create vectors for testing */
  X = N_VCloneVectorArray(3, V);

  Y[0] = N_VCloneVectorArray(3, V);
  Y[1] = N_VCloneVectorArray(3, V);
  Y[2] = N_VCloneVectorArray(3, V);

  Z[0] = N_VCloneVectorArray(3, V);
  Z[1] = N_VCloneVectorArray(3, V);
  Z[2] = N_VCloneVectorArray(3, V);

  /*
   * Case 1a (nvec = 1, nsum = 1):
   * Z[0][0] = a[0] X[0] + Y[0][0], N_VLinearSum
   */

  /* fill scaling and vector data */
  a[0] = TWO;

  N_VConst(ONE,     X[0]);
  N_VConst(NEG_ONE, Y[0][0]);

  start_time = get_time();
  ierr = N_VScaleAddMultiVectorArray(1, 1, a, X, Y, Y);
  sync_device();
  stop_time = get_time();

  /* Y[0][0] should be vector of +1 */
  if (ierr == 0)
    failure = check_ans(ONE, Y[0][0], local_length);
  else
    failure = 1;

  if (failure) {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 1a, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 1a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 1b (nvec = 1, nsum = 1):
   * Z[0][0] = a[0] X[0] + Y[0][0], N_VLinearSum
   */

  /* fill scaling and vector data */
  a[0] = TWO;

  N_VConst(ONE,     X[0]);
  N_VConst(NEG_ONE, Y[0][0]);
  N_VConst(ZERO,    Z[0][0]);

  start_time = get_time();
  ierr = N_VScaleAddMultiVectorArray(1, 1, a, X, Y, Z);
  sync_device();
  stop_time = get_time();

  /* Z[0][0] should be vector of +1 */
  if (ierr == 0)
    failure = check_ans(ONE, Z[0][0], local_length);
  else
    failure = 1;

  if (failure) {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 1b, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 1b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 2a (nvec = 1, nsum > 1):
   * Y[j][0] = a[j] X[0] + Y[j][0], N_VScaleAddMulti
   */

  /* fill scaling and vector data */
  a[0] = ONE;
  a[1] = NEG_TWO;
  a[2] = TWO;

  N_VConst(ONE, X[0]);

  N_VConst(NEG_TWO, Y[0][0]);
  N_VConst(TWO,     Y[1][0]);
  N_VConst(NEG_ONE, Y[2][0]);

  start_time = get_time();
  ierr = N_VScaleAddMultiVectorArray(1, 3, a, X, Y, Y);
  sync_device();
  stop_time = get_time();

  /* Y[i][0] should be a vector of -1, 0, +1 */
  if (ierr == 0) {
    failure  = check_ans(NEG_ONE, Y[0][0], local_length);
    failure += check_ans(ZERO,    Y[1][0], local_length);
    failure += check_ans(ONE,     Y[2][0], local_length);
  } else {
    failure = 1;
  }

  if (failure) {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 2a, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 2a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 2b (nvec = 1, nsum > 1):
   * Z[j][0] = a[j] X[0] + Y[j][0], N_VScaleAddMulti
   */

  /* fill scaling and vector data */
  a[0] = ONE;
  a[1] = NEG_TWO;
  a[2] = TWO;

  N_VConst(ONE, X[0]);

  N_VConst(NEG_TWO, Y[0][0]);
  N_VConst(TWO,     Y[1][0]);
  N_VConst(NEG_ONE, Y[2][0]);

  N_VConst(ZERO, Z[0][0]);
  N_VConst(ONE,  Z[1][0]);
  N_VConst(TWO,  Z[2][0]);

  start_time = get_time();
  ierr = N_VScaleAddMultiVectorArray(1, 3, a, X, Y, Z);
  sync_device();
  stop_time = get_time();

  /* Z[i][0] should be a vector of -1, 0, +1 */
  if (ierr == 0) {
    failure  = check_ans(NEG_ONE, Z[0][0], local_length);
    failure += check_ans(ZERO,    Z[1][0], local_length);
    failure += check_ans(ONE,     Z[2][0], local_length);
  } else {
    failure = 1;
  }

  if (failure) {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 2b, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 2b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 3a (nvec > 1, nsum = 1):
   * Y[0][i] = a[0] X[i] + Y[0][i], N_VLinearSumVectorArray
   */

  /* fill scaling and vector data */
  a[0] = TWO;

  N_VConst(HALF,    X[0]);
  N_VConst(NEG_ONE, X[1]);
  N_VConst(ONE,     X[2]);

  N_VConst(NEG_TWO, Y[0][0]);
  N_VConst(TWO,     Y[0][1]);
  N_VConst(NEG_ONE, Y[0][2]);

  start_time = get_time();
  ierr = N_VScaleAddMultiVectorArray(3, 1, a, X, Y, Y);
  sync_device();
  stop_time = get_time();

  /* Y[0][i] should be vector of -1, 0, +1 */
  if (ierr == 0) {
    failure  = check_ans(NEG_ONE, Y[0][0], local_length);
    failure += check_ans(ZERO,    Y[0][1], local_length);
    failure += check_ans(ONE,     Y[0][2], local_length);
  } else {
    failure = 1;
  }

  if (failure) {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 3a, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 3a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 3b (nvec > 1, nsum = 1):
   * Z[j][0] = a[j] X[0] + Y[j][0], N_VLinearSumVectorArray
   */

  /* fill scaling and vector data */
  a[0] = TWO;

  N_VConst(HALF,    X[0]);
  N_VConst(NEG_ONE, X[1]);
  N_VConst(ONE,     X[2]);

  N_VConst(NEG_TWO, Y[0][0]);
  N_VConst(TWO,     Y[0][1]);
  N_VConst(NEG_ONE, Y[0][2]);

  N_VConst(TWO, Z[0][0]);
  N_VConst(TWO, Z[0][1]);
  N_VConst(TWO, Z[0][2]);

  start_time = get_time();
  ierr = N_VScaleAddMultiVectorArray(3, 1, a, X, Y, Z);
  sync_device();
  stop_time = get_time();

  /* Z[0][i] should be vector of -1, 0, +1 */
  if (ierr == 0) {
    failure  = check_ans(NEG_ONE, Z[0][0], local_length);
    failure += check_ans(ZERO,    Z[0][1], local_length);
    failure += check_ans(ONE,     Z[0][2], local_length);
  } else {
    failure = 1;
  }

  if (failure) {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 3b, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 3b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 4a (nvec > 1, nsum > 1):
   * Y[j][i] = a[j] X[i] + Y[j][i], N_VScaleAddMultiVectorArray
   */

  /* fill scaling and vector data */
  a[0] = TWO;
  a[1] = ONE;
  a[2] = NEG_TWO;

  N_VConst(HALF,     X[0]);
  N_VConst(NEG_TWO,  Y[0][0]);
  N_VConst(NEG_HALF, Y[1][0]);
  N_VConst(TWO,      Y[2][0]);

  N_VConst(ONE,     X[1]);
  N_VConst(NEG_ONE, Y[0][1]);
  N_VConst(NEG_TWO, Y[1][1]);
  N_VConst(TWO,     Y[2][1]);

  N_VConst(NEG_TWO,     X[2]);
  N_VConst(TWO,         Y[0][2]);
  N_VConst(TWO*TWO,     Y[1][2]);
  N_VConst(NEG_TWO*TWO, Y[2][2]);

  start_time = get_time();
  ierr = N_VScaleAddMultiVectorArray(3, 3, a, X, Y, Y);
  sync_device();
  stop_time = get_time();

  if (ierr == 0) {
    /* Y[i][0] should be vector of -1, 0, +1 */
    failure  = check_ans(NEG_ONE, Y[0][0], local_length);
    failure += check_ans(ZERO,    Y[1][0], local_length);
    failure += check_ans(ONE,     Y[2][0], local_length);

    /* Y[i][1] should be vector of +1, -1, 0 */
    failure += check_ans(ONE,     Y[0][1], local_length);
    failure += check_ans(NEG_ONE, Y[1][1], local_length);
    failure += check_ans(ZERO,    Y[2][1], local_length);

    /* Y[i][2] should be vector of -2, 2, 0 */
    failure += check_ans(NEG_TWO, Y[0][2], local_length);
    failure += check_ans(TWO,     Y[1][2], local_length);
    failure += check_ans(ZERO,    Y[2][2], local_length);
  } else {
    failure = 1;
  }

  if (failure) {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 4a, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 4a \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /*
   * Case 4b (nvec > 1, nsum > 1):
   * Z[j][i] = a[j] X[i] + Y[j][i], N_VScaleAddMultiVectorArray
   */

  /* fill scaling and vector data */
  a[0] = TWO;
  a[1] = ONE;
  a[2] = NEG_TWO;

  N_VConst(HALF, X[0]);

  N_VConst(NEG_TWO,  Y[0][0]);
  N_VConst(NEG_HALF, Y[1][0]);
  N_VConst(TWO,      Y[2][0]);

  N_VConst(HALF, Z[0][0]);
  N_VConst(HALF, Z[1][0]);
  N_VConst(HALF, Z[2][0]);

  N_VConst(ONE, X[1]);

  N_VConst(NEG_ONE, Y[0][1]);
  N_VConst(NEG_TWO, Y[1][1]);
  N_VConst(TWO,     Y[2][1]);

  N_VConst(HALF, Z[0][1]);
  N_VConst(HALF, Z[1][1]);
  N_VConst(HALF, Z[2][1]);

  N_VConst(NEG_TWO, X[2]);

  N_VConst(TWO,         Y[0][2]);
  N_VConst(TWO*TWO,     Y[1][2]);
  N_VConst(NEG_TWO*TWO, Y[2][2]);

  N_VConst(HALF, Z[0][2]);
  N_VConst(HALF, Z[1][2]);
  N_VConst(HALF, Z[2][2]);

  start_time = get_time();
  ierr = N_VScaleAddMultiVectorArray(3, 3, a, X, Y, Z);
  sync_device();
  stop_time = get_time();

  if (ierr == 0) {
    /* Z[i][0] should be vector of -1, 0, +1 */
    failure  = check_ans(NEG_ONE, Z[0][0], local_length);
    failure += check_ans(ZERO,    Z[1][0], local_length);
    failure += check_ans(ONE,     Z[2][0], local_length);

    /* Z[i][1] should be vector of +1, -1, 0 */
    failure += check_ans(ONE,     Z[0][1], local_length);
    failure += check_ans(NEG_ONE, Z[1][1], local_length);
    failure += check_ans(ZERO,    Z[2][1], local_length);

    /* Z[i][2] should be vector of -2, 2, 0 */
    failure += check_ans(NEG_TWO, Z[0][2], local_length);
    failure += check_ans(TWO,     Z[1][2], local_length);
    failure += check_ans(ZERO,    Z[2][2], local_length);
  } else {
    failure = 1;
  }

  if (failure) {
    printf(">>> FAILED test -- N_VScaleAddMultiVectorArray Case 4b, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VScaleAddMultiVectorArray Case 4b \n");
  }

  /* find max time across all processes */
  maxt = max_time(V, stop_time - start_time);
  PRINT_TIME("N_VScaleAddMultiVectorArray", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(X, 3);
  N_VDestroyVectorArray(Y[0], 3);
  N_VDestroyVectorArray(Y[1], 3);
  N_VDestroyVectorArray(Y[2], 3);
  N_VDestroyVectorArray(Z[0], 3);
  N_VDestroyVectorArray(Z[1], 3);
  N_VDestroyVectorArray(Z[2], 3);

  return(fails);
}